

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter>
::createInstance(MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetPixelCenter> *this,
                Context *context)

{
  TestInstance *this_00;
  
  this_00 = (TestInstance *)operator_new(0x30);
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::MSInstance
            ((MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *)this_00,
             context,&(this->super_MultisampleCaseBase).m_imageMSParams);
  return this_00;
}

Assistant:

TestInstance* MSCase<MSCaseInterpolateAtOffsetPixelCenter>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceInterpolateScreenPosition>(context, m_imageMSParams);
}